

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

long VRSFloatInt(uint8_t **pStart)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  pbVar2 = *pStart;
  bVar1 = *pbVar2;
  uVar4 = (ulong)pbVar2[2] | (ulong)bVar1 << 0x10 | (ulong)pbVar2[1] << 8;
  *pStart = pbVar2 + 3;
  uVar3 = -(ulong)((uint)uVar4 & 0x7fffff);
  if (-1 < (char)bVar1) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

long VRSFloatInt (const uint8_t* &pStart)
{
    long l = long((unsigned long)(pStart[0]) << 16 |
                  (unsigned long)(pStart[1]) <<  8 |
                  (unsigned long)(pStart[2]));
    pStart += 3;                        // eat the number
    // test for negative value
    if (l & 0x800000) {
        l &= 0x7fffffL;                 // remove the negative flag
        l *= -1L;                       // make value negative
    }
    return l;
}